

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void build_backtrace(JSContext *ctx,JSValue error_obj,char *filename,int line_num,
                    int backtrace_flags)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  JSValueUnion JVar7;
  JSValue this_obj;
  JSValue this_obj_00;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  JSStackFrame *pJVar16;
  uint8_t *buf;
  JSValueUnion *pJVar17;
  uint8_t *buf_end;
  uint uVar18;
  bool bVar19;
  JSValue val1;
  JSValue JVar20;
  JSValue JVar21;
  uint local_88;
  int v;
  JSValueUnion local_80;
  int64_t local_78;
  JSStackFrame *local_70;
  JSContext *local_68;
  DynBuf dbuf;
  
  local_78 = error_obj.tag;
  local_80 = error_obj.u;
  js_dbuf_init(ctx,&dbuf);
  if (filename != (char *)0x0) {
    dbuf_printf(&dbuf,"    at %s",filename);
    if (line_num != -1) {
      dbuf_printf(&dbuf,":%d",CONCAT44(0,line_num));
    }
    dbuf_putc(&dbuf,'\n');
    JVar20 = JS_NewString(ctx,filename);
    this_obj.tag = local_78;
    this_obj.u.ptr = local_80.ptr;
    JVar21.tag = local_78;
    JVar21.u.ptr = local_80.ptr;
    JS_DefinePropertyValue(ctx,JVar21,0x31,JVar20,3);
    JVar20.tag = 0;
    JVar20.u = (JSValueUnion)CONCAT44(0,line_num);
    JS_DefinePropertyValue(ctx,this_obj,0x32,JVar20,3);
    if ((backtrace_flags & 2U) != 0) goto LAB_0012419e;
  }
  pJVar16 = (JSStackFrame *)&ctx->rt->current_stack_frame;
  bVar19 = (backtrace_flags & 1U) == 0;
  local_68 = ctx;
LAB_00123f26:
  do {
    while( true ) {
      pJVar16 = pJVar16->prev_frame;
      if (pJVar16 == (JSStackFrame *)0x0) goto LAB_0012419e;
      if (bVar19) break;
      bVar19 = true;
    }
    if ((int)(pJVar16->cur_func).tag == -1) {
      pvVar5 = (pJVar16->cur_func).u.ptr;
      lVar6 = *(long *)((long)pvVar5 + 0x18);
      uVar13 = *(uint *)(lVar6 + (long)(int)(~*(uint *)(lVar6 + 0x20) | 0xffffffc9) * 4);
      while (uVar13 != 0) {
        uVar12 = (ulong)uVar13;
        if (*(int *)(lVar6 + 0x3c + uVar12 * 8) == 0x36) {
          if (*(uint *)(lVar6 + 0x38 + uVar12 * 8) < 0x40000000) {
            pJVar17 = (JSValueUnion *)((uVar12 - 1) * 0x10 + *(long *)((long)pvVar5 + 0x20));
            JVar7 = pJVar17[1];
            if ((JVar7.int32 == -7) &&
               (val1.tag = (int64_t)JVar7.ptr, val1.u.ptr = pJVar17->ptr,
               pcVar11 = JS_ToCString(ctx,val1), pcVar11 != (char *)0x0)) {
              pcVar14 = pcVar11;
              if (*pcVar11 == '\0') {
                pcVar14 = "<anonymous>";
              }
              goto LAB_00123fb5;
            }
          }
          break;
        }
        uVar13 = *(uint *)(lVar6 + 0x38 + uVar12 * 8) & 0x3ffffff;
      }
    }
    pcVar11 = (char *)0x0;
    pcVar14 = "<anonymous>";
LAB_00123fb5:
    dbuf_printf(&dbuf,"    at %s",pcVar14);
    JS_FreeCString(ctx,pcVar11);
    pvVar5 = (pJVar16->cur_func).u.ptr;
    uVar12 = (ulong)*(ushort *)((long)pvVar5 + 6);
    if ((0x31 < uVar12) || ((0x2200000012000U >> (uVar12 & 0x3f) & 1) == 0)) {
      dbuf_printf(&dbuf," (native)");
      dbuf_putc(&dbuf,'\n');
      goto LAB_00123f26;
    }
    lVar6 = *(long *)((long)pvVar5 + 0x30);
    uVar2 = *(ushort *)(lVar6 + 0x19);
    if ((uVar2 >> 10 & 1) != 0) {
      buf = *(uint8_t **)(lVar6 + 0x70);
      uVar13 = 0xffffffff;
      local_70 = pJVar16;
      if (buf != (uint8_t *)0x0) {
        uVar3 = *(uint *)(lVar6 + 0x20);
        iVar4 = *(int *)&pJVar16->cur_pc;
        buf_end = buf + *(int *)(lVar6 + 0x6c);
        uVar18 = 0;
        uVar9 = *(uint *)(lVar6 + 100);
        do {
          uVar13 = uVar9;
          if (buf_end <= buf) break;
          uVar1 = *buf;
          buf = buf + 1;
          if (uVar1 == '\0') {
            uVar9 = get_leb128(&local_88,buf,buf_end);
            uVar15 = local_88;
            if (-1 < (int)uVar9) {
              uVar10 = get_sleb128(&v,buf + uVar9,buf_end);
              if (-1 < (int)uVar10) {
                buf = buf + uVar9 + uVar10;
                uVar9 = v + uVar13;
                goto LAB_001240b7;
              }
            }
            uVar13 = *(uint *)(lVar6 + 100);
            break;
          }
          bVar8 = uVar1 - 1;
          uVar15 = (uint)(bVar8 / 5);
          uVar9 = (uVar13 + bVar8 % 5) - 1;
LAB_001240b7:
          uVar18 = uVar18 + uVar15;
        } while (uVar18 <= ~uVar3 + iVar4);
      }
      ctx = local_68;
      pcVar14 = JS_AtomToCString(local_68,*(JSAtom *)(lVar6 + 0x60));
      pcVar11 = pcVar14;
      if (pcVar14 == (char *)0x0) {
        pcVar11 = "<null>";
      }
      dbuf_printf(&dbuf," (%s",pcVar11);
      JS_FreeCString(ctx,pcVar14);
      if (uVar13 != 0xffffffff) {
        dbuf_printf(&dbuf,":%d",(ulong)uVar13);
      }
      dbuf_putc(&dbuf,')');
      pJVar16 = local_70;
    }
    dbuf_putc(&dbuf,'\n');
  } while ((uVar2 >> 0xb & 1) == 0);
LAB_0012419e:
  dbuf_putc(&dbuf,'\0');
  if (dbuf.error == 0) {
    JVar21 = JS_NewString(ctx,(char *)dbuf.buf);
  }
  else {
    JVar21 = (JSValue)(ZEXT816(2) << 0x40);
  }
  dbuf_free(&dbuf);
  this_obj_00.tag = local_78;
  this_obj_00.u.float64 = local_80.float64;
  JS_DefinePropertyValue(ctx,this_obj_00,0x35,JVar21,3);
  return;
}

Assistant:

static void build_backtrace(JSContext *ctx, JSValueConst error_obj,
                            const char *filename, int line_num,
                            int backtrace_flags)
{
    JSStackFrame *sf;
    JSValue str;
    DynBuf dbuf;
    const char *func_name_str;
    const char *str1;
    JSObject *p;
    BOOL backtrace_barrier;
    
    js_dbuf_init(ctx, &dbuf);
    if (filename) {
        dbuf_printf(&dbuf, "    at %s", filename);
        if (line_num != -1)
            dbuf_printf(&dbuf, ":%d", line_num);
        dbuf_putc(&dbuf, '\n');
        str = JS_NewString(ctx, filename);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_fileName, str,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_lineNumber, JS_NewInt32(ctx, line_num),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
        if (backtrace_flags & JS_BACKTRACE_FLAG_SINGLE_LEVEL)
            goto done;
    }
    for(sf = ctx->rt->current_stack_frame; sf != NULL; sf = sf->prev_frame) {
        if (backtrace_flags & JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL) {
            backtrace_flags &= ~JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL;
            continue;
        }
        func_name_str = get_func_name(ctx, sf->cur_func);
        if (!func_name_str || func_name_str[0] == '\0')
            str1 = "<anonymous>";
        else
            str1 = func_name_str;
        dbuf_printf(&dbuf, "    at %s", str1);
        JS_FreeCString(ctx, func_name_str);

        p = JS_VALUE_GET_OBJ(sf->cur_func);
        backtrace_barrier = FALSE;
        if (js_class_has_bytecode(p->class_id)) {
            JSFunctionBytecode *b;
            const char *atom_str;
            int line_num1;

            b = p->u.func.function_bytecode;
            backtrace_barrier = b->backtrace_barrier;
            if (b->has_debug) {
                line_num1 = find_line_num(ctx, b,
                                          sf->cur_pc - b->byte_code_buf - 1);
                atom_str = JS_AtomToCString(ctx, b->debug.filename);
                dbuf_printf(&dbuf, " (%s",
                            atom_str ? atom_str : "<null>");
                JS_FreeCString(ctx, atom_str);
                if (line_num1 != -1)
                    dbuf_printf(&dbuf, ":%d", line_num1);
                dbuf_putc(&dbuf, ')');
            }
        } else {
            dbuf_printf(&dbuf, " (native)");
        }
        dbuf_putc(&dbuf, '\n');
        /* stop backtrace if JS_EVAL_FLAG_BACKTRACE_BARRIER was used */
        if (backtrace_barrier)
            break;
    }
 done:
    dbuf_putc(&dbuf, '\0');
    if (dbuf_error(&dbuf))
        str = JS_NULL;
    else
        str = JS_NewString(ctx, (char *)dbuf.buf);
    dbuf_free(&dbuf);
    JS_DefinePropertyValue(ctx, error_obj, JS_ATOM_stack, str,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
}